

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O3

void convertARGBToARGB32PM_sse4<false>(uint *buffer,uint *src,int count)

{
  long lVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  undefined1 in_XMM2 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM4 [16];
  ushort uVar12;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 in_XMM5 [16];
  undefined1 auVar13 [16];
  ushort uVar21;
  undefined1 auVar14 [16];
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  undefined1 in_XMM6 [16];
  ushort uVar29;
  
  auVar5 = _DAT_006a23c0;
  uVar6 = 0;
  if (3 < count) {
    uVar6 = 0;
    auVar10 = pmovzxbw(in_XMM2,0x8080808080808080);
    do {
      auVar14 = *(undefined1 (*) [16])(src + uVar6);
      if ((auVar5 & auVar14) == (undefined1  [16])0x0) {
        *(undefined1 (*) [16])(buffer + uVar6) = (undefined1  [16])0x0;
      }
      else if ((auVar5 & ~auVar14) == (undefined1  [16])0x0) {
        if (buffer != src) {
          *(undefined1 (*) [16])(buffer + uVar6) = auVar14;
        }
      }
      else {
        in_XMM4 = pmovzxbw(in_XMM4,auVar14);
        auVar11._0_2_ = CONCAT11(0,auVar14[8]);
        auVar11[2] = auVar14[9];
        auVar11[3] = 0;
        auVar11[4] = auVar14[10];
        auVar11[5] = 0;
        auVar11[6] = auVar14[0xb];
        auVar11[7] = 0;
        auVar11[8] = auVar14[0xc];
        auVar11[9] = 0;
        auVar11[10] = auVar14[0xd];
        auVar11[0xb] = 0;
        auVar11[0xc] = auVar14[0xe];
        auVar11[0xd] = 0;
        auVar11[0xe] = auVar14[0xf];
        auVar11[0xf] = 0;
        auVar13 = pshuflw(in_XMM5,in_XMM4,0xff);
        auVar13 = pshufhw(auVar13,auVar13,0xff);
        uVar12 = auVar13._0_2_ * in_XMM4._0_2_;
        uVar15 = auVar13._2_2_ * in_XMM4._2_2_;
        uVar16 = auVar13._4_2_ * in_XMM4._4_2_;
        uVar17 = auVar13._6_2_ * in_XMM4._6_2_;
        uVar18 = auVar13._8_2_ * in_XMM4._8_2_;
        uVar19 = auVar13._10_2_ * in_XMM4._10_2_;
        uVar20 = auVar13._12_2_ * in_XMM4._12_2_;
        uVar21 = auVar13._14_2_ * in_XMM4._14_2_;
        auVar13 = pshuflw(in_XMM6,auVar11,0xff);
        auVar13 = pshufhw(auVar13,auVar13,0xff);
        uVar22 = auVar13._0_2_ * auVar11._0_2_;
        uVar23 = auVar13._2_2_ * (ushort)auVar14[9];
        uVar24 = auVar13._4_2_ * (ushort)auVar14[10];
        uVar25 = auVar13._6_2_ * (ushort)auVar14[0xb];
        uVar26 = auVar13._8_2_ * (ushort)auVar14[0xc];
        uVar27 = auVar13._10_2_ * (ushort)auVar14[0xd];
        uVar28 = auVar13._12_2_ * (ushort)auVar14[0xe];
        uVar29 = auVar13._14_2_ * (ushort)auVar14[0xf];
        auVar14._0_2_ = (ushort)(uVar12 + auVar10._0_2_ + (uVar12 >> 8)) >> 8;
        auVar14._2_2_ = (ushort)(uVar15 + auVar10._2_2_ + (uVar15 >> 8)) >> 8;
        auVar14._4_2_ = (ushort)(uVar16 + auVar10._4_2_ + (uVar16 >> 8)) >> 8;
        auVar14._6_2_ = (ushort)(uVar17 + auVar10._6_2_ + (uVar17 >> 8)) >> 8;
        auVar14._8_2_ = (ushort)(uVar18 + auVar10._8_2_ + (uVar18 >> 8)) >> 8;
        auVar14._10_2_ = (ushort)(uVar19 + auVar10._10_2_ + (uVar19 >> 8)) >> 8;
        auVar14._12_2_ = (ushort)(uVar20 + auVar10._12_2_ + (uVar20 >> 8)) >> 8;
        auVar14._14_2_ = (ushort)(uVar21 + auVar10._14_2_ + (uVar21 >> 8)) >> 8;
        auVar13._0_2_ = (ushort)(uVar22 + auVar10._0_2_ + (uVar22 >> 8)) >> 8;
        auVar13._2_2_ = (ushort)(uVar23 + auVar10._2_2_ + (uVar23 >> 8)) >> 8;
        auVar13._4_2_ = (ushort)(uVar24 + auVar10._4_2_ + (uVar24 >> 8)) >> 8;
        auVar13._6_2_ = (ushort)(uVar25 + auVar10._6_2_ + (uVar25 >> 8)) >> 8;
        auVar13._8_2_ = (ushort)(uVar26 + auVar10._8_2_ + (uVar26 >> 8)) >> 8;
        auVar13._10_2_ = (ushort)(uVar27 + auVar10._10_2_ + (uVar27 >> 8)) >> 8;
        auVar13._12_2_ = (ushort)(uVar28 + auVar10._12_2_ + (uVar28 >> 8)) >> 8;
        auVar13._14_2_ = (ushort)(uVar29 + auVar10._14_2_ + (uVar29 >> 8)) >> 8;
        auVar14 = pblendw(auVar14,in_XMM4,0x88);
        in_XMM6 = pblendw(auVar13,auVar11,0x88);
        sVar3 = auVar14._0_2_;
        sVar4 = auVar14._2_2_;
        in_XMM5[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar14[2] - (0xff < sVar4);
        in_XMM5[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar14[0] - (0xff < sVar3);
        sVar3 = auVar14._4_2_;
        in_XMM5[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar14[4] - (0xff < sVar3);
        sVar3 = auVar14._6_2_;
        in_XMM5[3] = (0 < sVar3) * (sVar3 < 0x100) * auVar14[6] - (0xff < sVar3);
        sVar3 = auVar14._8_2_;
        in_XMM5[4] = (0 < sVar3) * (sVar3 < 0x100) * auVar14[8] - (0xff < sVar3);
        sVar3 = auVar14._10_2_;
        in_XMM5[5] = (0 < sVar3) * (sVar3 < 0x100) * auVar14[10] - (0xff < sVar3);
        sVar3 = auVar14._12_2_;
        in_XMM5[6] = (0 < sVar3) * (sVar3 < 0x100) * auVar14[0xc] - (0xff < sVar3);
        sVar3 = auVar14._14_2_;
        in_XMM5[7] = (0 < sVar3) * (sVar3 < 0x100) * auVar14[0xe] - (0xff < sVar3);
        sVar3 = in_XMM6._0_2_;
        in_XMM5[8] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[0] - (0xff < sVar3);
        sVar3 = in_XMM6._2_2_;
        in_XMM5[9] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[2] - (0xff < sVar3);
        sVar3 = in_XMM6._4_2_;
        in_XMM5[10] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[4] - (0xff < sVar3);
        sVar3 = in_XMM6._6_2_;
        in_XMM5[0xb] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[6] - (0xff < sVar3);
        sVar3 = in_XMM6._8_2_;
        in_XMM5[0xc] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[8] - (0xff < sVar3);
        sVar3 = in_XMM6._10_2_;
        in_XMM5[0xd] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[10] - (0xff < sVar3);
        sVar3 = in_XMM6._12_2_;
        in_XMM5[0xe] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[0xc] - (0xff < sVar3);
        sVar3 = in_XMM6._14_2_;
        in_XMM5[0xf] = (0 < sVar3) * (sVar3 < 0x100) * in_XMM6[0xe] - (0xff < sVar3);
        *(undefined1 (*) [16])(buffer + uVar6) = in_XMM5;
      }
      uVar6 = uVar6 + 4;
    } while (uVar6 < count - 3);
  }
  if ((int)uVar6 < count) {
    uVar6 = uVar6 & 0xffffffff;
    lVar8 = 0;
    do {
      uVar2 = src[uVar6 + lVar8];
      uVar9 = (uVar2 & 0xff00ff) * (uVar2 >> 0x18);
      uVar7 = (uVar2 >> 8 & 0xff) * (uVar2 >> 0x18);
      buffer[uVar6 + lVar8] =
           uVar2 & 0xff000000 | (uVar7 >> 8) + uVar7 + 0x80 & 0xff00 |
           uVar9 + (uVar9 >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff;
      if (1 < (uint)lVar8) {
        return;
      }
      lVar1 = uVar6 + 1 + lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar1 < count);
  }
  return;
}

Assistant:

static void convertARGBToARGB32PM_sse4(uint *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i half = _mm_set1_epi16(0x0080);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            if (!_mm_testc_si128(srcVector, alphaMask)) {
                if (RGBA)
                    srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
                __m128i src1 = _mm_unpacklo_epi8(srcVector, zero);
                __m128i src2 = _mm_unpackhi_epi8(srcVector, zero);
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                src1 = _mm_mullo_epi16(src1, alpha1);
                src2 = _mm_mullo_epi16(src2, alpha2);
                src1 = _mm_add_epi16(src1, _mm_srli_epi16(src1, 8));
                src2 = _mm_add_epi16(src2, _mm_srli_epi16(src2, 8));
                src1 = _mm_add_epi16(src1, half);
                src2 = _mm_add_epi16(src2, half);
                src1 = _mm_srli_epi16(src1, 8);
                src2 = _mm_srli_epi16(src2, 8);
                src1 = _mm_blend_epi16(src1, alpha1, 0x88);
                src2 = _mm_blend_epi16(src2, alpha2, 0x88);
                srcVector = _mm_packus_epi16(src1, src2);
                _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            } else {
                if (RGBA)
                    _mm_storeu_si128((__m128i *)&buffer[i], _mm_shuffle_epi8(srcVector, rgbaMask));
                else if (buffer != src)
                    _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        uint v = qPremultiply(src[i]);
        buffer[i] = RGBA ? RGBA2ARGB(v) : v;
    }
}